

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O1

Lifetime * __thiscall
SCCLiveness::InsertLifetime(SCCLiveness *this,StackSym *stackSym,RegNum reg,Instr *currentInstr)

{
  uint uVar1;
  JitArenaAllocator *pJVar2;
  Func *this_00;
  NodeBase *pNVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  RegSlot slotIndex;
  Type *ppLVar7;
  undefined1 local_60 [8];
  EditingIterator iter;
  NodeBase local_38;
  Lifetime *newLlifetime;
  
  uVar5 = IR::Instr::GetNumber(currentInstr);
  local_38.next = (Type)new<Memory::JitArenaAllocator>(0xa0,this->tempAlloc,0x3f1274);
  pJVar2 = this->tempAlloc;
  ((Lifetime *)local_38.next)->sym = stackSym;
  (((Lifetime *)local_38.next)->defList).
  super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = 0;
  ((Lifetime *)local_38.next)->regionUseCount = (uint32 *)0x0;
  ((Lifetime *)local_38.next)->regionUseCountAdjust = (uint32 *)0x0;
  (((Lifetime *)local_38.next)->defList).
  super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&((Lifetime *)local_38.next)->defList;
  (((Lifetime *)local_38.next)->defList).allocator = &pJVar2->super_ArenaAllocator;
  (((Lifetime *)local_38.next)->useList).
  super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = 0;
  (((Lifetime *)local_38.next)->useList).
  super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&((Lifetime *)local_38.next)->useList;
  (((Lifetime *)local_38.next)->useList).allocator = &pJVar2->super_ArenaAllocator;
  ((Lifetime *)local_38.next)->spillStackSlot = (StackSlot *)0x0;
  ((Lifetime *)local_38.next)->lastUseLabel = (LabelInstr *)0x0;
  ((Lifetime *)local_38.next)->region = (Region *)0x0;
  ((Lifetime *)local_38.next)->alloc = pJVar2;
  (((Lifetime *)local_38.next)->intUsageBv).word = 0;
  (((Lifetime *)local_38.next)->regPreference).word = 0;
  ((Lifetime *)local_38.next)->start = uVar5;
  ((Lifetime *)local_38.next)->end = uVar5;
  ((Lifetime *)local_38.next)->lastAllocationStart = 0;
  ((Lifetime *)local_38.next)->previousDefBlockNumber = 0;
  ((Lifetime *)local_38.next)->useCount = 0;
  ((Lifetime *)local_38.next)->useCountAdjust = 0;
  ((Lifetime *)local_38.next)->allDefsCost = 0;
  ((Lifetime *)local_38.next)->reg = reg;
  ((Lifetime *)local_38.next)->totalOpHelperLengthByEnd = 0;
  *(ushort *)&((Lifetime *)local_38.next)->field_0x9c =
       (ushort)*(undefined4 *)&((Lifetime *)local_38.next)->field_0x9c & 0xc000 | 8;
  uVar1 = this->totalOpHelperFullVisitedLength;
  iter.super_EditingIterator.last = (NodeBase *)stackSym;
  uVar6 = CurrentOpHelperVisitedLength(this,currentInstr);
  *(uint *)(local_38.next + 0x13) = uVar6 + uVar1;
  local_60 = (undefined1  [8])&this->lifetimeList;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
  do {
    bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_60);
    if (!bVar4) break;
    ppLVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_60);
  } while (uVar5 < (*ppLVar7)->start);
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
            ((EditingIterator *)local_60,
             (ArenaAllocator *)
             (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)((long)local_60 + 0x10))
             ->super_SListNodeBase<Memory::ArenaAllocator>).next,(Lifetime **)&local_38);
  bVar4 = Func::IsJitInDebugMode(this->func);
  pNVar3 = iter.super_EditingIterator.last;
  if ((bVar4) && (((ulong)iter.super_EditingIterator.last[3].next & 0x2000) != 0)) {
    this_00 = this->func;
    slotIndex = StackSym::GetByteCodeRegSlot((StackSym *)iter.super_EditingIterator.last);
    bVar4 = Func::IsNonTempLocalVar(this_00,slotIndex);
    if (bVar4) {
      *(ushort *)((long)(local_38.next + 0x13) + 4) =
           *(ushort *)((long)(local_38.next + 0x13) + 4) & 0xfff7;
    }
  }
  pNVar3[9].next = local_38.next;
  return (Lifetime *)local_38.next;
}

Assistant:

Lifetime *
SCCLiveness::InsertLifetime(StackSym *stackSym, RegNum reg, IR::Instr *const currentInstr)
{
    const uint start = currentInstr->GetNumber(), end = start;
    Lifetime * newLlifetime = JitAnew(tempAlloc, Lifetime, tempAlloc, stackSym, reg, start, end);
    newLlifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);

    // Find insertion point
    // This looks like a search, but we should almost exit on the first iteration, except
    // when we have loops and some lifetimes where extended.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, &this->lifetimeList, iter)
    {
        if (lifetime->start <= start)
        {
            break;
        }
    }
    NEXT_SLIST_ENTRY_EDITING;

    iter.InsertBefore(newLlifetime);

    // let's say 'var a = 10;'. if a is not used in the function, we still want to have the instr, otherwise the write-through will not happen and upon debug bailout
    // we would not be able to restore the values to see in locals window.
    if (this->func->IsJitInDebugMode() && stackSym->HasByteCodeRegSlot() && this->func->IsNonTempLocalVar(stackSym->GetByteCodeRegSlot()))
    {
        newLlifetime->isDeadStore = false;
    }

    stackSym->scratch.linearScan.lifetime = newLlifetime;
    return newLlifetime;
}